

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2505:30),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2524:6)>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2505:30),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2524:6)>
          *this,ExceptionOrValue *output)

{
  WebSocket *pWVar1;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  Own<kj::_::PromiseNode> local_328;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_318;
  ExceptionOr<kj::Promise<void>_> local_188;
  
  local_318.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_318.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_318.super_ExceptionOrValue);
  if (local_318.super_ExceptionOrValue.exception.ptr.isSet == true) {
    pWVar1 = (this->errorHandler).to;
    if (local_318.super_ExceptionOrValue.exception.ptr.field_1.value.type == DISCONNECTED) {
      (*pWVar1->_vptr_WebSocket[3])(&local_328);
    }
    else {
      if (local_318.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ ==
          0) {
        local_318.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr = "";
      }
      (*pWVar1->_vptr_WebSocket[2])
                (&local_328,pWVar1,0x3ea,
                 local_318.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.
                 ptr,local_318.super_ExceptionOrValue.exception.ptr.field_1.value.description.
                     content.size_ +
                     (local_318.super_ExceptionOrValue.exception.ptr.field_1.value.description.
                      content.size_ == 0));
    }
    local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_188.value.ptr.isSet = true;
    local_188.value.ptr.field_1.value.super_PromiseBase.node.disposer = local_328.disposer;
    local_188.value.ptr.field_1.value.super_PromiseBase.node.ptr = local_328.ptr;
    local_328.ptr = (PromiseNode *)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_188)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_188);
    Own<kj::_::PromiseNode>::dispose(&local_328);
  }
  else if (local_318.value.ptr.isSet == true) {
    anon_class_16_2_e7bfda6a_for_func::operator()
              ((anon_class_16_2_e7bfda6a_for_func *)&local_328,(Message *)&this->func);
    local_188.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_188.value.ptr.isSet = true;
    local_188.value.ptr.field_1.value.super_PromiseBase.node.disposer = local_328.disposer;
    local_188.value.ptr.field_1.value.super_PromiseBase.node.ptr = local_328.ptr;
    local_328.ptr = (PromiseNode *)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_188)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_188);
    Own<kj::_::PromiseNode>::dispose(&local_328);
  }
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::~ExceptionOr
            (&local_318);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }